

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

bool __thiscall
ddd::DaTrie<true,_true,_true>::search_prefix(DaTrie<true,_true,_true> *this,Query *query)

{
  pointer pBVar1;
  uint uVar2;
  Bc BVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)query->node_pos_;
  BVar3 = pBVar1[uVar5];
  uVar2 = BVar3._0_4_;
  if (-1 < (int)uVar2) {
    uVar4 = query->pos_;
    do {
      if (BVar3._0_4_ == 0x7fffffff) {
        return false;
      }
      uVar6 = (uint)(byte)query->key_[uVar4] ^ BVar3._0_4_;
      if ((*(uint *)&pBVar1[uVar6].field_0x4 & 0x7fffffff) != (uint)uVar5) {
        return false;
      }
      query->node_pos_ = uVar6;
      query->pos_ = uVar4 + 1;
      query->is_finished_ = query->key_[uVar4] == '\0';
      BVar3 = pBVar1[uVar6];
      uVar2 = BVar3._0_4_;
      uVar5 = (ulong)uVar6;
      uVar4 = uVar4 + 1;
    } while (-1 < (int)uVar2);
  }
  query->value_ = uVar2 & 0x7fffffff;
  return true;
}

Assistant:

bool search_prefix(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto base = bc_[query.node_pos()].base();
      if (base == INVALID_VALUE) {
        return false;
      }
      auto child_pos = base ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    query.set_value(bc_[query.node_pos()].value());
    return true;
  }